

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_gather_offset_sampler_2d_shadow(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  bool bVar2;
  char *__s;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  string shaderSource;
  allocator<char> local_d1;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &shaderSource.field_2;
  shaderSource._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shaderSource,"textureGatherOffset - sampler2DShadow","");
  NegativeTestContext::beginSection(ctx,&shaderSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar5);
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_d1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource.field_2._8_8_ = plVar3[3];
        shaderSource._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource._M_dataplus._M_p = (pointer)*plVar3;
      }
      shaderSource._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&shaderSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_00._M_string_length = shaderSource._M_string_length;
      shaderSource_00._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_00.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_00.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_01._M_string_length = shaderSource._M_string_length;
      shaderSource_01._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_01.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_01.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_01);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_02._M_string_length = shaderSource._M_string_length;
      shaderSource_02._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_02.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_02.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_b0[0],shaderSource_02);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_03._M_string_length = shaderSource._M_string_length;
      shaderSource_03._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_03.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_03.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_d0[0],shaderSource_03);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_offset_sampler_2d_shadow (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGatherOffset - sampler2DShadow");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}